

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_affixutils.cpp
# Opt level: O0

UnicodeString *
icu_63::number::impl::AffixUtils::escape(UnicodeString *__return_storage_ptr__,UnicodeString *input)

{
  int32_t iVar1;
  int iVar2;
  ConstChar16Ptr local_40;
  uint local_38;
  UChar32 cp;
  undefined1 local_21;
  int local_20;
  int local_1c;
  int32_t offset;
  AffixPatternState state;
  UnicodeString *input_local;
  UnicodeString *output;
  
  local_1c = 0;
  local_20 = 0;
  local_21 = 0;
  _offset = input;
  input_local = __return_storage_ptr__;
  UnicodeString::UnicodeString(__return_storage_ptr__);
  do {
    iVar2 = local_20;
    iVar1 = UnicodeString::length(_offset);
    if (iVar1 <= iVar2) {
      if (local_1c == 2) {
        UnicodeString::append(__return_storage_ptr__,L'\'');
      }
      return __return_storage_ptr__;
    }
    local_38 = UnicodeString::char32At(_offset,local_20);
    if (local_38 == 0x25) {
LAB_002d4cf8:
      if (local_1c == 0) {
        UnicodeString::append(__return_storage_ptr__,L'\'');
        UnicodeString::append(__return_storage_ptr__,local_38);
        local_1c = 2;
      }
      else {
        UnicodeString::append(__return_storage_ptr__,local_38);
      }
    }
    else if (local_38 == 0x27) {
      ConstChar16Ptr::ConstChar16Ptr(&local_40,L"\'\'");
      UnicodeString::append(__return_storage_ptr__,&local_40,-1);
      ConstChar16Ptr::~ConstChar16Ptr(&local_40);
    }
    else {
      if ((((local_38 == 0x2b) || (local_38 == 0x2d)) || (local_38 == 0xa4)) || (local_38 == 0x2030)
         ) goto LAB_002d4cf8;
      if (local_1c == 2) {
        UnicodeString::append(__return_storage_ptr__,L'\'');
        UnicodeString::append(__return_storage_ptr__,local_38);
        local_1c = 0;
      }
      else {
        UnicodeString::append(__return_storage_ptr__,local_38);
      }
    }
    iVar2 = 2;
    if (local_38 < 0x10000) {
      iVar2 = 1;
    }
    local_20 = iVar2 + local_20;
  } while( true );
}

Assistant:

UnicodeString AffixUtils::escape(const UnicodeString &input) {
    AffixPatternState state = STATE_BASE;
    int32_t offset = 0;
    UnicodeString output;
    for (; offset < input.length();) {
        UChar32 cp = input.char32At(offset);

        switch (cp) {
            case u'\'':
                output.append(u"''", -1);
                break;

            case u'-':
            case u'+':
            case u'%':
            case u'‰':
            case u'¤':
                if (state == STATE_BASE) {
                    output.append(u'\'');
                    output.append(cp);
                    state = STATE_INSIDE_QUOTE;
                } else {
                    output.append(cp);
                }
                break;

            default:
                if (state == STATE_INSIDE_QUOTE) {
                    output.append(u'\'');
                    output.append(cp);
                    state = STATE_BASE;
                } else {
                    output.append(cp);
                }
                break;
        }
        offset += U16_LENGTH(cp);
    }

    if (state == STATE_INSIDE_QUOTE) {
        output.append(u'\'');
    }

    return output;
}